

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<double> * __thiscall
tinyusdz::primvar::PrimVar::get_default_value<double>
          (optional<double> *__return_storage_ptr__,PrimVar *this)

{
  optional<double> local_20;
  
  get_value<double>(&local_20,this);
  __return_storage_ptr__->has_value_ = local_20.has_value_;
  if (local_20.has_value_ == true) {
    __return_storage_ptr__->contained = local_20.contained;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }